

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  QUEUE *this;
  ostream *poVar5;
  size_type sVar6;
  QUEUE *pQVar7;
  ulong uVar8;
  bool bVar9;
  int e;
  queue<int,_std::deque<int,_std::allocator<int>_>_> arg_list;
  cmd_paresr lab01_parser;
  
  cmd_paresr::cmd_paresr(&lab01_parser,argc,argv);
  this = (QUEUE *)0x0;
  do {
    iVar3 = cmd_paresr::now_pos(&lab01_parser);
    iVar4 = cmd_paresr::ops_num(&lab01_parser);
    if (iVar4 <= iVar3) {
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      cmd_paresr::~cmd_paresr(&lab01_parser);
      return 0;
    }
    std::queue<int,std::deque<int,std::allocator<int>>>::
    queue<std::deque<int,std::allocator<int>>,void>(&arg_list);
    cVar2 = cmd_paresr::next_step(&lab01_parser,&arg_list);
    switch(cVar2) {
    case 'A':
      std::operator<<((ostream *)&std::cout," A");
      iVar3 = *arg_list.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur;
      pQVar7 = (QUEUE *)operator_new(0x30);
      QUEUE::QUEUE(pQVar7,iVar3);
      (*(pQVar7->super_STACK)._vptr_STACK[10])(pQVar7,this);
      std::deque<int,_std::allocator<int>_>::pop_front
                ((deque<int,_std::allocator<int>_> *)&arg_list);
      std::operator<<((ostream *)&std::cout," ");
      (*(pQVar7->super_STACK)._vptr_STACK[6])(pQVar7);
      this = pQVar7;
      break;
    case 'B':
    case 'D':
    case 'E':
    case 'F':
    case 'H':
    case 'J':
    case 'K':
    case 'L':
    case 'M':
      break;
    case 'C':
      std::operator<<((ostream *)&std::cout," C");
      pQVar7 = (QUEUE *)operator_new(0x30);
      QUEUE::QUEUE(pQVar7,this);
      std::operator<<((ostream *)&std::cout," ");
      (*(pQVar7->super_STACK)._vptr_STACK[6])(pQVar7);
      this = pQVar7;
      break;
    case 'G':
      std::operator<<((ostream *)&std::cout," G");
      uVar1 = *arg_list.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur;
      iVar3 = (*(this->super_STACK)._vptr_STACK[1])(this);
      if (iVar3 <= (int)uVar1) {
        poVar5 = std::operator<<((ostream *)&std::cout," E");
        std::endl<char,std::char_traits<char>>(poVar5);
LAB_00102720:
        exit(0);
      }
      poVar5 = std::operator<<((ostream *)&std::cout," ");
      iVar3 = (*(this->super_STACK)._vptr_STACK[2])(this,(ulong)uVar1);
      std::ostream::operator<<(poVar5,iVar3);
LAB_0010250e:
      std::deque<int,_std::allocator<int>_>::pop_front
                ((deque<int,_std::allocator<int>_> *)&arg_list);
      break;
    case 'I':
      std::operator<<((ostream *)&std::cout," I");
      sVar6 = std::deque<int,_std::allocator<int>_>::size
                        ((deque<int,_std::allocator<int>_> *)&arg_list);
      uVar8 = 0;
      if (0 < (int)sVar6) {
        uVar8 = sVar6 & 0xffffffff;
      }
      while (iVar3 = (int)uVar8, uVar8 = (ulong)(iVar3 - 1), iVar3 != 0) {
        iVar3 = (*(this->super_STACK)._vptr_STACK[9])(this);
        if (iVar3 != 0) {
          iVar3 = (**(this->super_STACK)._vptr_STACK)(this);
          iVar4 = (*(this->super_STACK)._vptr_STACK[1])(this);
          if (iVar3 - iVar4 < (int)sVar6) {
            poVar5 = std::operator<<((ostream *)&std::cout," E");
            std::endl<char,std::char_traits<char>>(poVar5);
            goto LAB_00102720;
          }
        }
        (*(this->super_STACK)._vptr_STACK[3])
                  (this,(ulong)(uint)*arg_list.c.super__Deque_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Deque_impl_data._M_start._M_cur);
        std::deque<int,_std::allocator<int>_>::pop_front
                  ((deque<int,_std::allocator<int>_> *)&arg_list);
      }
      std::operator<<((ostream *)&std::cout," ");
      (*(this->super_STACK)._vptr_STACK[6])(this);
      break;
    case 'N':
      std::operator<<((ostream *)&std::cout," N");
      poVar5 = std::operator<<((ostream *)&std::cout," ");
      iVar3 = (*(this->super_STACK)._vptr_STACK[1])(this);
      std::ostream::operator<<(poVar5,iVar3);
      break;
    case 'O':
      std::operator<<((ostream *)&std::cout," O");
      iVar3 = *arg_list.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur;
      iVar4 = (*(this->super_STACK)._vptr_STACK[1])(this);
      if (iVar4 < iVar3) {
        poVar5 = std::operator<<((ostream *)&std::cout," E");
        std::endl<char,std::char_traits<char>>(poVar5);
        goto LAB_00102720;
      }
      if (iVar3 < 1) {
        iVar3 = 0;
      }
      while (bVar9 = iVar3 != 0, iVar3 = iVar3 + -1, bVar9) {
        (*(this->super_STACK)._vptr_STACK[4])(this,&e);
      }
      std::deque<int,_std::allocator<int>_>::pop_front
                ((deque<int,_std::allocator<int>_> *)&arg_list);
      iVar3 = (*(this->super_STACK)._vptr_STACK[1])(this);
      if (iVar3 != 0) {
        std::operator<<((ostream *)&std::cout," ");
        (*(this->super_STACK)._vptr_STACK[6])(this);
      }
      break;
    default:
      if (cVar2 == 'S') {
        std::operator<<((ostream *)&std::cout,"S");
        iVar3 = *arg_list.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                 super__Deque_impl_data._M_start._M_cur;
        this = (QUEUE *)operator_new(0x30);
        QUEUE::QUEUE(this,iVar3);
        poVar5 = std::operator<<((ostream *)&std::cout," ");
        std::ostream::operator<<(poVar5,iVar3);
        goto LAB_0010250e;
      }
    }
    std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
              ((_Deque_base<int,_std::allocator<int>_> *)&arg_list);
  } while( true );
}

Assistant:

int main(int argc, char **argv) {
  char op;
  int arg;
  QUEUE *myqueue = nullptr;
  // Set output file
  cmd_paresr lab01_parser = cmd_paresr(argc, argv);
  while (lab01_parser.now_pos() < lab01_parser.ops_num()) {
    queue<int> arg_list;
    op = lab01_parser.next_step(arg_list);
    switch (op) {
      case 'S': {
        cout << "S";
        arg = arg_list.front();
        myqueue = new QUEUE(arg);
        cout << " " << arg;
        arg_list.pop();
        break;
      }
      case 'I': {
        cout << " I";
        int size = arg_list.size();
        for (int i = 0; i < size; i++) {
          // Test if the stack can overflow
          if (myqueue->full()) {
            if (myqueue->size() - int(*myqueue) < size) {
              cout << " E" << endl;
              exit(0);
            }
          }
          arg = arg_list.front();
          *myqueue << arg;
          arg_list.pop();
        }
        cout << " ";
        myqueue->print();
        break;
      }
      case 'O': {
        cout << " O";
        int e;
        arg = arg_list.front();
        // Test if the stack can be empty
        if (int(*myqueue) < arg) {
          cout << " E" << endl;
          exit(0);
        }
        for (int i = 0; i < arg; i++)
          *myqueue >> e;
        arg_list.pop();
        if (int(*myqueue) != 0) {
          cout << " ";
          myqueue->print();
        }
        break;
      }
      case 'A': {
        cout << " A";
        arg = arg_list.front();
        QUEUE *new_stack = new QUEUE(arg);
        *new_stack = *myqueue;
        myqueue = new_stack;
        arg_list.pop();
        cout << " ";
        myqueue->print();
        break;
      }
      case 'C': {
        cout << " C";
        QUEUE *new_stack = new QUEUE(*myqueue);
        myqueue = new_stack;
        cout << " ";
        myqueue->print();
        break;
      }
      case 'N': {
        cout << " N";
        cout << " " << int(*myqueue);        
        break;
      }
      case 'G': {
        cout << " G";
        arg = arg_list.front();
        if (arg >= int(*myqueue)) {
          cout << " E" << endl;
          exit(0);
        }
        cout << " " << (*myqueue)[arg];
        arg_list.pop();
        break;
      }
    }
  }
  cout << endl;
  return 0;
}